

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numpy.h
# Opt level: O3

bool pybind11::array_t<unsigned_char,_16>::check_(handle h)

{
  _func_bool_PyObject_ptr_PyObject_ptr *p_Var1;
  PyTypeObject *pPVar2;
  bool bVar3;
  int iVar4;
  npy_api *pnVar5;
  handle local_20;
  
  pnVar5 = detail::npy_api::get();
  if (((h.m_ptr)->ob_type != pnVar5->PyArray_Type_) && (iVar4 = PyType_IsSubtype(), iVar4 == 0)) {
    return false;
  }
  p_Var1 = pnVar5->PyArray_EquivTypes_;
  pPVar2 = h.m_ptr[3].ob_type;
  dtype::dtype((dtype *)&local_20,2);
  bVar3 = (*p_Var1)((PyObject *)pPVar2,local_20.m_ptr);
  handle::dec_ref(&local_20);
  return bVar3;
}

Assistant:

static bool check_(handle h) {
        const auto &api = detail::npy_api::get();
        return api.PyArray_Check_(h.ptr())
               && api.PyArray_EquivTypes_(detail::array_proxy(h.ptr())->descr,
                                          dtype::of<T>().ptr())
               && detail::check_flags(h.ptr(), ExtraFlags & (array::c_style | array::f_style));
    }